

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall BCLog::Logger::DisconnectTestLogger(Logger *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  StdLockGuard scoped_lock;
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffc8,(StdMutex *)0x87b02f);
  *(undefined1 *)(in_RDI + 0x48) = 1;
  if (*(long *)(in_RDI + 0x28) != 0) {
    fclose(*(FILE **)(in_RDI + 0x28));
  }
  *(undefined8 *)(in_RDI + 0x28) = 0;
  std::__cxx11::
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  ::clear((list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
           *)in_stack_ffffffffffffffc8);
  *(undefined8 *)(in_RDI + 0x50) = 1000000;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::clear
            (in_stack_ffffffffffffffc8);
  StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::DisconnectTestLogger()
{
    StdLockGuard scoped_lock(m_cs);
    m_buffering = true;
    if (m_fileout != nullptr) fclose(m_fileout);
    m_fileout = nullptr;
    m_print_callbacks.clear();
    m_max_buffer_memusage = DEFAULT_MAX_LOG_BUFFER;
    m_cur_buffer_memusage = 0;
    m_buffer_lines_discarded = 0;
    m_msgs_before_open.clear();
}